

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

Appendable * __thiscall
icu_63::number::FormattedNumber::appendTo
          (FormattedNumber *this,Appendable *appendable,UErrorCode *status)

{
  uint uVar1;
  char16_t *pcVar2;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fResults == (UFormattedNumberData *)0x0) {
      *status = this->fErrorCode;
    }
    else {
      pcVar2 = impl::NumberStringBuilder::chars(&this->fResults->string);
      uVar1 = impl::NumberStringBuilder::length(&this->fResults->string);
      (*(appendable->super_UObject)._vptr_UObject[5])(appendable,pcVar2,(ulong)uVar1);
    }
  }
  return appendable;
}

Assistant:

Appendable& FormattedNumber::appendTo(Appendable& appendable, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return appendable;
    }
    if (fResults == nullptr) {
        status = fErrorCode;
        return appendable;
    }
    appendable.appendString(fResults->string.chars(), fResults->string.length());
    return appendable;
}